

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O2

pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_llama_partial_utf8> *
decode_utf8(pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_llama_partial_utf8>
            *__return_storage_ptr__,string *src,llama_partial_utf8 partial_start)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  int iVar4;
  llama_partial_utf8 lVar5;
  uint32_t value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> code_points;
  uint local_24;
  
  pbVar3 = (byte *)(src->_M_dataplus)._M_p;
  code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&code_points,src->_M_string_length + 1);
  uVar2 = (ulong)partial_start >> 0x20;
  value = partial_start.value;
  lVar5 = partial_start;
  while( true ) {
    bVar1 = *pbVar3;
    iVar4 = (int)uVar2;
    if ((bVar1 == 0) || (iVar4 < 1)) break;
    if ((bVar1 & 0xffffffc0) != 0x80) {
      local_24 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&code_points,&local_24);
      (__return_storage_ptr__->first).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->first).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->first).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->second).value = 0;
      (__return_storage_ptr__->second).n_remain = -1;
      goto LAB_001db31d;
    }
    lVar5.value = lVar5.value << 6 | bVar1 & 0x3f;
    lVar5.n_remain = 0;
    pbVar3 = pbVar3 + 1;
    uVar2 = (ulong)(iVar4 - 1);
    value = lVar5.value;
  }
  if ((partial_start.n_remain != 0 && -1 < (long)partial_start) && iVar4 == 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&code_points,&value);
  }
  do {
    bVar1 = *pbVar3;
    if (bVar1 == 0) {
      local_24 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&code_points,&local_24);
      (__return_storage_ptr__->first).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->first).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->first).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      lVar5 = (llama_partial_utf8)(uVar2 << 0x20 | (ulong)value);
LAB_001db319:
      __return_storage_ptr__->second = lVar5;
LAB_001db31d:
      code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return __return_storage_ptr__;
    }
    uVar2 = (ulong)(decode_utf8::lookup[bVar1 >> 4] - 1);
    if ((bVar1 >> 4 & 0xfc) == 8) {
      if (code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      local_24 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&code_points,&local_24);
      (__return_storage_ptr__->first).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->first).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->first).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           code_points.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      lVar5 = (llama_partial_utf8)(uVar2 << 0x20);
      goto LAB_001db319;
    }
    value = ~(-1 << (8U - (char)decode_utf8::lookup[bVar1 >> 4] & 0x1f)) & (uint)bVar1;
    while( true ) {
      pbVar3 = pbVar3 + 1;
      iVar4 = (int)uVar2;
      if ((*pbVar3 == 0) || (iVar4 < 1)) break;
      value = value << 6 | *pbVar3 & 0x3f;
      uVar2 = (ulong)(iVar4 - 1);
    }
    if (iVar4 == 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&code_points,&value);
    }
  } while( true );
}

Assistant:

static std::pair<std::vector<uint32_t>, llama_partial_utf8> decode_utf8(
        const std::string & src,
        llama_partial_utf8 partial_start) {
    static const int      lookup[] = { 1, 1, 1, 1, 1, 1, 1, 1, 0, 0, 0, 0, 2, 2, 3, 4 };
    const char          * pos      = src.c_str();
    std::vector<uint32_t> code_points;

    // common english strings have the same number of codepoints and bytes. `+ 1` for the terminating 0.
    code_points.reserve(src.size() + 1);
    uint32_t value    = partial_start.value;
    int      n_remain = partial_start.n_remain;

    // continue previous decode, if applicable
    while (*pos != 0 && n_remain > 0) {
        uint8_t next_byte = static_cast<uint8_t>(*pos);
        if ((next_byte >> 6) != 2) {
            // invalid sequence, abort
            code_points.push_back(0);
            return std::make_pair(std::move(code_points), llama_partial_utf8{ 0, -1 });
        }
        value = (value << 6) + (next_byte & 0x3F);
        ++pos;
        --n_remain;
    }

    if (partial_start.n_remain > 0 && n_remain == 0) {
        code_points.push_back(value);
    }

    // decode any subsequent utf-8 sequences, which may end in an incomplete one
    while (*pos != 0) {
        uint8_t first_byte = static_cast<uint8_t>(*pos);
        uint8_t highbits   = first_byte >> 4;
        n_remain   = lookup[highbits] - 1;

        if (n_remain < 0) {
            // invalid sequence, abort
            code_points.clear();
            code_points.push_back(0);
            return std::make_pair(std::move(code_points), llama_partial_utf8{ 0, n_remain });
        }

        uint8_t mask  = (1 << (7 - n_remain)) - 1;
        value = first_byte & mask;

        ++pos;
        while (*pos != 0 && n_remain > 0) {
            value = (value << 6) + (static_cast<uint8_t>(*pos) & 0x3F);
            ++pos;
            --n_remain;
        }
        if (n_remain == 0) {
            code_points.push_back(value);
        }
    }
    code_points.push_back(0);

    return std::make_pair(std::move(code_points), llama_partial_utf8{ value, n_remain });
}